

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O3

void vu_draw_update(t_gobj *client,_glist *glist)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _glist *p_Var9;
  undefined8 extraout_RAX;
  ulong uVar10;
  ulong uVar11;
  char local_b8 [136];
  undefined8 uVar8;
  
  p_Var9 = (_glist *)CONCAT71((int7)((ulong)in_RAX >> 8),*(byte *)&client[0x4b].g_next);
  if ((*(byte *)&client[0x4b].g_next & 1) != 0) {
    iVar2 = glist_isvisible(glist);
    uVar8 = CONCAT44(extraout_var,iVar2);
    if (iVar2 != 0) {
      iVar2 = *(int *)((long)&client[3].g_pd[1].c_floatmethod + 4);
      iVar1 = *(int *)((long)&client[4].g_pd + 4);
      iVar7 = iVar1 + 3;
      if (-1 < iVar1) {
        iVar7 = iVar1;
      }
      iVar3 = text_ypix((t_text *)client,glist);
      iVar4 = text_xpix((t_text *)client,glist);
      iVar1 = *(int *)((long)&client[4].g_pd + 4);
      iVar5 = sprintf(local_b8,"%lxRCOVER",client);
      p_Var9 = glist_getcanvas((_glist *)CONCAT44(extraout_var_00,iVar5));
      pdgui_vmess((char *)0x0,"crs iiii",p_Var9,"coords",local_b8,
                  (ulong)(uint)(((iVar7 >> 2) - iVar2) + iVar4),(ulong)(uint)(iVar3 - iVar2),
                  (ulong)(uint)((iVar2 - (iVar7 >> 2)) + iVar4 + iVar1),
                  (ulong)(uint)((0x28 - *(int *)&client[0x49].g_next) *
                                (*(int *)&client[0x49].g_pd + 1) * iVar2 + (iVar3 - iVar2)));
      uVar8 = extraout_RAX;
    }
    p_Var9 = (_glist *)
             (CONCAT71((int7)((ulong)uVar8 >> 8),*(undefined1 *)&client[0x4b].g_next) &
             0xfffffffffffffffe);
    *(char *)&client[0x4b].g_next = (char)p_Var9;
  }
  if (((ulong)p_Var9 & 2) != 0) {
    p_Var9 = glist_getcanvas(p_Var9);
    iVar2 = glist_isvisible(glist);
    if (iVar2 != 0) {
      iVar2 = *(int *)((long)&client[3].g_pd[1].c_floatmethod + 4);
      uVar6 = text_xpix((t_text *)client,glist);
      iVar7 = text_ypix((t_text *)client,glist);
      sprintf(local_b8,"%lxPLED",client);
      iVar1 = *(int *)((long)&client[0x49].g_pd + 4);
      if ((long)iVar1 == 0) {
        uVar11 = (ulong)(*(int *)((long)&client[4].g_pd + 4) / 2 + uVar6);
        pdgui_vmess((char *)0x0,"crs rk",p_Var9,"itemconfigure",local_b8,"-fill",
                    (ulong)*(uint *)&client[0x45].g_pd);
        uVar10 = (ulong)(uint)(iVar7 + iVar2 * 10);
        pdgui_vmess((char *)0x0,"crs iiii",p_Var9,"coords",local_b8,uVar11,uVar10,uVar11,uVar10);
      }
      else {
        iVar3 = iemgui_vu_col[iVar1];
        iVar4 = (*(int *)&client[0x49].g_pd + 1) * iVar2;
        uVar10 = (ulong)(uint)(((0x29 - iVar1) * iVar4 + iVar7) - iVar4 / 2);
        pdgui_vmess((char *)0x0,"crs iiii",p_Var9,"coords",local_b8,(ulong)uVar6,uVar10,
                    (ulong)(uVar6 + iVar2 + *(int *)((long)&client[4].g_pd + 4)),uVar10);
        pdgui_vmess((char *)0x0,"crs rk",p_Var9,"itemconfigure",local_b8,"-fill",
                    (ulong)(uint)iemgui_color_hex[iVar3]);
      }
    }
    *(byte *)&client[0x4b].g_next = *(byte *)&client[0x4b].g_next & 0xfd;
  }
  return;
}

Assistant:

static void vu_draw_update(t_gobj *client, t_glist *glist)
{
    t_vu *x = (t_vu *)client;
    if (x->x_updaterms)
    {
        vu_update_rms(x, glist);
        x->x_updaterms = 0;
    }
    if (x->x_updatepeak)
    {
        vu_update_peak(x, glist);
        x->x_updatepeak = 0;
    }
}